

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileReader.cpp
# Opt level: O2

bool __thiscall
BufferedFileReader::openStream
          (BufferedFileReader *this,int readerID,char *streamName,int pid,CodecInfo *codecInfo)

{
  bool bVar1;
  FileReaderData *this_00;
  int __fd;
  
  __fd = (int)streamName;
  this_00 = (FileReaderData *)BufferedReader::getReader(&this->super_BufferedReader,readerID);
  if ((this_00 != (FileReaderData *)0x0) &&
     ((this_00->super_ReaderData)._vptr_ReaderData == (_func_int **)&PTR__FileReaderData_00249f28))
  {
    (this_00->super_ReaderData).m_firstBlock = true;
    (this_00->super_ReaderData).m_lastBlock = false;
    std::__cxx11::string::assign((char *)&(this_00->super_ReaderData).m_streamName);
    this_00->m_fileHeaderSize = 0;
    File::close(&this_00->m_file,__fd);
    bVar1 = FileReaderData::openStream(this_00);
    return bVar1;
  }
  return false;
}

Assistant:

bool BufferedFileReader::openStream(const int readerID, const char* streamName, int pid, const CodecInfo* codecInfo)
{
    const auto data = dynamic_cast<FileReaderData*>(getReader(readerID));

    if (data == nullptr)
    {
        LTRACE(LT_ERROR, 0, "Unknown readerID " << readerID);
        return false;
    }
    data->m_firstBlock = true;
    data->m_lastBlock = false;
    data->m_streamName = streamName;
    data->m_fileHeaderSize = 0;
    data->closeStream();
    if (!data->openStream())
    {
        return false;
    }
    return true;
}